

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomTwoAction.cpp
# Opt level: O1

ActionResults * __thiscall GreenRoomTwoAction::Go(GreenRoomTwoAction *this)

{
  itemType iVar1;
  ActionResults *this_00;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    this_00 = (ActionResults *)operator_new(0x30);
    paVar3 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"You go north.\n","");
    ActionResults::ActionResults(this_00,G_ROOM4_KID,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == SOUTH) {
      this_00 = (ActionResults *)operator_new(0x30);
      paVar3 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"You go south.\n","");
      ActionResults::ActionResults(this_00,G_ROOM3_BASIN,&local_60);
      _Var2._M_p = local_60._M_dataplus._M_p;
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == EAST) {
        this_00 = (ActionResults *)operator_new(0x30);
        paVar3 = &local_80.field_2;
        local_80._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"You go back to the boat room.\n","");
        ActionResults::ActionResults(this_00,G_ROOM1_SIDE2,&local_80);
        _Var2._M_p = local_80._M_dataplus._M_p;
      }
      else {
        iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        this_00 = (ActionResults *)operator_new(0x30);
        if (iVar1 == WEST) {
          paVar3 = &local_a0.field_2;
          local_a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"There is a wall, you can\'t go that way.\n","");
          ActionResults::ActionResults(this_00,CURRENT,&local_a0);
          _Var2._M_p = local_a0._M_dataplus._M_p;
        }
        else {
          paVar3 = &local_c0.field_2;
          local_c0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"You can\'t go there.\n","");
          ActionResults::ActionResults(this_00,CURRENT,&local_c0);
          _Var2._M_p = local_c0._M_dataplus._M_p;
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p);
  }
  return this_00;
}

Assistant:

ActionResults *GreenRoomTwoAction::Go() {

    if (commands->getMainItem() == NORTH) {
        return new ActionResults(G_ROOM4_KID, "You go north.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM3_BASIN, "You go south.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(G_ROOM1_SIDE2, "You go back to the boat room.\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "There is a wall, you can't go that way.\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");
}